

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCallback.cpp
# Opt level: O0

bool __thiscall HighsCallback::callbackAction(HighsCallback *this,int callback_type,string *message)

{
  bool bVar1;
  HighsCallbackDataOut *__args_2;
  HighsCallback *in_RDX;
  undefined4 in_ESI;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *in_RDI;
  bool action;
  undefined4 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  int __args;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *this_00;
  undefined1 local_41 [45];
  undefined4 local_14;
  bool local_1;
  
  local_14 = in_ESI;
  bVar1 = callbackActive(in_RDX,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  __args = (int)((ulong)in_RDX >> 0x20);
  if (bVar1) {
    this_00 = in_RDI;
    __args_2 = (HighsCallbackDataOut *)std::__cxx11::string::c_str();
    __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_41 + 1),(char *)__args_2,(allocator *)__args_1);
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
    ::operator()(this_00,__args,__args_1,__args_2,
                 (anon_struct_16_2_bb6a87e9 *)CONCAT44(local_14,in_stack_ffffffffffffff80),in_RDI);
    std::__cxx11::string::~string((string *)(local_41 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_41);
    local_1 = *(int *)&this_00[7].super__Function_base._M_manager != 0;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HighsCallback::callbackAction(const int callback_type,
                                   std::string message) {
  if (!callbackActive(callback_type)) return false;
  this->user_callback(callback_type, message.c_str(), &this->data_out,
                      &this->data_in, this->user_callback_data);
  // Assess any action
  bool action = this->data_in.user_interrupt;

  // Check for no action if case not handled internally
  if (callback_type == kCallbackMipImprovingSolution ||
      callback_type == kCallbackMipSolution ||
      callback_type == kCallbackMipLogging ||
      callback_type == kCallbackMipGetCutPool ||
      callback_type == kCallbackMipDefineLazyConstraints ||
      callback_type == kCallbackMipUserSolution)
    assert(!action);
  return action;
}